

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::drawDocument(QHexView *this,QTextCursor *c)

{
  QColor *pQVar1;
  QHexDelegate *pQVar2;
  QHexDocument *pQVar3;
  QHexOptions *pQVar4;
  Data *pDVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  QPalette *pQVar10;
  QColor *pQVar11;
  quint64 qVar12;
  QColor *pQVar13;
  ulong uVar14;
  qint64 qVar15;
  byte bVar16;
  QHexView *s;
  sockaddr *__addr;
  sockaddr *__addr_00;
  long lVar17;
  long lVar18;
  uint uVar19;
  QChar QVar20;
  uint uVar21;
  ulong local_170;
  QTextBlockFormat bf;
  QArrayDataPointer<char16_t> local_148;
  QTextCursor *local_128;
  QHexView *local_120;
  QByteArray linebytes;
  QTextCharFormat acf;
  QString addrstr;
  QTextCharFormat cf;
  QTextCharFormat addrformat;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_70 [40];
  QArrayDataPointer<char> local_48;
  
  if (this->m_hexdocument != (QHexDocument *)0x0) {
    local_128 = c;
    if (((this->m_options).flags & 0x20) == 0) {
      QFontMetricsF::height();
    }
    QAbstractScrollArea::verticalScrollBar();
    iVar8 = QAbstractSlider::value();
    QTextCharFormat::QTextCharFormat(&addrformat);
    pQVar10 = (QPalette *)QWidget::palette();
    pQVar11 = QPalette::color(pQVar10,Active,Highlight);
    QBrush::QBrush((QBrush *)&addrstr,pQVar11,SolidPattern);
    QTextFormat::setForeground((QTextFormat *)&addrformat,(QBrush *)&addrstr);
    local_170 = (ulong)iVar8;
    QBrush::~QBrush((QBrush *)&addrstr);
    pQVar4 = &this->m_options;
    pQVar11 = &(this->m_options).linealternatebackground;
    pQVar1 = &(this->m_options).linebackground;
    lVar18 = 0;
    local_120 = this;
    while( true ) {
      bVar6 = QHexDocument::isEmpty(this->m_hexdocument);
      if ((!bVar6) &&
         ((qVar12 = lines(this), qVar12 <= local_170 ||
          (iVar8 = visibleLines(this,false), iVar8 <= lVar18)))) break;
      lVar17 = (this->m_options).linelength * local_170 + (this->m_options).baseaddress;
      QString::number((ulonglong)&bf,(int)lVar17);
      uVar9 = addressWidth(this);
      s = (QHexView *)0x30;
      QString::rightJustified
                ((longlong)&linebytes,(QChar)(char16_t)(QArrayDataPointer<char16_t> *)&bf,
                 SUB41(uVar9,0));
      QString::toUpper_helper((QString *)&addrstr);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&linebytes);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      QTextCharFormat::QTextCharFormat(&acf);
      QBrush::QBrush((QBrush *)&linebytes,&pQVar4->headercolor,SolidPattern);
      QTextFormat::setForeground((QTextFormat *)&acf,(QBrush *)&linebytes);
      QBrush::~QBrush((QBrush *)&linebytes);
      if (((this->m_options).flags & 0x10) != 0) {
        pQVar10 = (QPalette *)QWidget::palette();
        pQVar13 = QPalette::color(pQVar10,Window);
        QBrush::QBrush((QBrush *)&linebytes,pQVar13,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)&acf,(QBrush *)&linebytes);
        QBrush::~QBrush((QBrush *)&linebytes);
      }
      pQVar2 = this->m_hexdelegate;
      if (pQVar2 != (QHexDelegate *)0x0) {
        s = this;
        (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,lVar17,&acf);
      }
      uVar14 = QHexCursor::line(this->m_hexcursor);
      if ((uVar14 == local_170) && (((this->m_options).flags & 0x40) != 0)) {
        pQVar10 = (QPalette *)QWidget::palette();
        pQVar13 = QPalette::color(pQVar10,Highlight);
        QBrush::QBrush((QBrush *)&linebytes,pQVar13,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)&acf,(QBrush *)&linebytes);
        QBrush::~QBrush((QBrush *)&linebytes);
        pQVar10 = (QPalette *)QWidget::palette();
        pQVar13 = QPalette::color(pQVar10,HighlightedText);
        QBrush::QBrush((QBrush *)&linebytes,pQVar13,SolidPattern);
        QTextFormat::setForeground((QTextFormat *)&acf,(QBrush *)&linebytes);
        QBrush::~QBrush((QBrush *)&linebytes);
      }
      operator+((QString *)&bf," ",&addrstr);
      operator+((QString *)&linebytes,(QString *)&bf," ");
      QTextCursor::insertText((QString *)local_128,(QTextCharFormat *)&linebytes);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&linebytes);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      getLine(&linebytes,this,local_170);
      QString::QString((QString *)&bf," ");
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_148);
      QTextCursor::insertText((QString *)local_128,(QTextCharFormat *)&bf);
      QTextFormat::~QTextFormat((QTextFormat *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      uVar9 = 0;
      while (uVar9 < (this->m_options).linelength) {
        QTextCharFormat::QTextCharFormat(&cf);
        for (uVar21 = 0; uVar19 = uVar9 + uVar21, uVar21 < (this->m_options).grouplength;
            uVar21 = uVar21 + 1) {
          _bf = (Data *)0x0;
          pQVar3 = this->m_hexdocument;
          uVar14 = (ulong)uVar19;
          qVar15 = positionFromLineCol(this,local_170,uVar14);
          iVar8 = QHexDocument::accept(pQVar3,(int)qVar15,__addr,(socklen_t *)s);
          if ((char)iVar8 == '\0') {
            QString::QString((QString *)&local_88,(QChar)(local_120->m_options).invalidchar.ucs);
            QString::repeated((longlong)&local_148);
            pDVar5 = _bf;
            _bf = local_148.d;
            local_148.d = pDVar5;
            local_148.ptr = (char16_t *)0x0;
            local_148.size = 0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
            bVar16 = 0;
          }
          else {
            if ((long)uVar14 < linebytes.d.size) {
              QByteArray::mid((longlong)(local_70 + 0x10),(longlong)&linebytes);
              QHexUtils::toHex((QByteArray *)&local_48,(QByteArray *)(local_70 + 0x10));
              QByteArray::toUpper_helper((QByteArray *)&local_88);
              QString::QString((QString *)&local_148,(QByteArray *)&local_88);
              pDVar5 = _bf;
              _bf = local_148.d;
              local_148.d = pDVar5;
              local_148.ptr = (char16_t *)0x0;
              local_148.size = 0;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
              QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
              QArrayDataPointer<char>::~QArrayDataPointer
                        ((QArrayDataPointer<char> *)(local_70 + 0x10));
            }
            else {
              QString::QString((QString *)&local_148,"  ");
              pDVar5 = _bf;
              _bf = local_148.d;
              local_148.d = pDVar5;
              local_148.ptr = (char16_t *)0x0;
              local_148.size = 0;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
            }
            if ((int)uVar19 < linebytes.d.size) {
              bVar16 = linebytes.d.ptr[uVar14];
            }
            else {
              bVar16 = 0;
            }
          }
          this = local_120;
          s = (QHexView *)(ulong)bVar16;
          drawFormat((QHexView *)&local_148,(QTextCursor *)local_120,(quint8)local_128,(QString *)s,
                     (QHexArea)(QArrayDataPointer<char16_t> *)&bf,2,local_170,SUB41(uVar19,0));
          QTextFormat::operator=((QTextFormat *)&cf,(QTextFormat *)&local_148);
          QTextFormat::~QTextFormat((QTextFormat *)&local_148);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
        }
        QString::QString((QString *)&bf," ");
        QTextCursor::insertText((QString *)local_128,(QTextCharFormat *)&bf);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
        QTextFormat::~QTextFormat((QTextFormat *)&cf);
        uVar9 = uVar19;
      }
      QString::QString((QString *)&bf," ");
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_148);
      QTextCursor::insertText((QString *)local_128,(QTextCharFormat *)&bf);
      QTextFormat::~QTextFormat((QTextFormat *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
      for (lVar17 = 0; (uint)lVar17 < (this->m_options).linelength; lVar17 = lVar17 + 1) {
        _bf = (Data *)0x0;
        pQVar3 = this->m_hexdocument;
        qVar15 = positionFromLineCol(this,local_170,lVar17);
        iVar8 = QHexDocument::accept(pQVar3,(int)qVar15,__addr_00,(socklen_t *)s);
        if ((char)iVar8 == '\0') {
          QString::operator=((QString *)&bf,(QChar)(local_120->m_options).invalidchar.ucs);
LAB_001937ec:
          bVar16 = 0;
        }
        else {
          QVar20.ucs = L' ';
          if (lVar17 < linebytes.d.size) {
            bVar16 = linebytes.d.ptr[lVar17];
            cVar7 = QChar::isPrint((int)(char)bVar16);
            if (cVar7 == '\0') {
              QVar20.ucs = (local_120->m_options).unprintablechar.ucs;
            }
            else {
              QVar20.ucs = (char16_t)bVar16;
            }
          }
          QString::operator=((QString *)&bf,QVar20);
          if (linebytes.d.size <= (int)(uint)lVar17) goto LAB_001937ec;
          bVar16 = linebytes.d.ptr[lVar17];
        }
        s = (QHexView *)(ulong)bVar16;
        drawFormat((QHexView *)local_70,(QTextCursor *)local_120,(quint8)local_128,(QString *)s,
                   (QHexArea)(QArrayDataPointer<char16_t> *)&bf,3,local_170,SUB81(lVar17,0));
        QTextFormat::~QTextFormat((QTextFormat *)local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bf);
        this = local_120;
      }
      QTextBlockFormat::QTextBlockFormat(&bf);
      if ((pQVar11->cspec == Invalid) || ((local_170 & 1) == 0)) {
        if ((pQVar1->cspec != Invalid) && ((local_170 & 1) == 0)) {
          QBrush::QBrush((QBrush *)&local_148,pQVar1,SolidPattern);
          QTextFormat::setBackground((QTextFormat *)&bf,(QBrush *)&local_148);
          goto LAB_001938c8;
        }
      }
      else {
        QBrush::QBrush((QBrush *)&local_148,pQVar11,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)&bf,(QBrush *)&local_148);
LAB_001938c8:
        QBrush::~QBrush((QBrush *)&local_148);
      }
      QTextCursor::setBlockFormat((QTextBlockFormat *)local_128);
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_148);
      QTextCursor::insertBlock((QTextBlockFormat *)local_128);
      QTextFormat::~QTextFormat((QTextFormat *)&local_148);
      bVar6 = QHexDocument::isEmpty(this->m_hexdocument);
      QTextFormat::~QTextFormat((QTextFormat *)&bf);
      QArrayDataPointer<char>::~QArrayDataPointer(&linebytes.d);
      QTextFormat::~QTextFormat((QTextFormat *)&acf);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&addrstr.d);
      if (bVar6) break;
      QFontMetricsF::height();
      local_170 = local_170 + 1;
      lVar18 = lVar18 + 1;
    }
    QTextFormat::~QTextFormat((QTextFormat *)&addrformat);
  }
  return;
}

Assistant:

void QHexView::drawDocument(QTextCursor& c) const {
    if(!m_hexdocument)
        return;

    qreal y = !m_options.hasFlag(QHexFlags::NoHeader) ? this->lineHeight() : 0;
    quint64 line = static_cast<quint64>(this->verticalScrollBar()->value());

    QTextCharFormat addrformat;
    addrformat.setForeground(
        this->palette().color(QPalette::Normal, QPalette::Highlight));

    for(qint64 l = 0; m_hexdocument->isEmpty() ||
                      (line < this->lines() && l < this->visibleLines());
        l++, line++, y += this->lineHeight()) {
        quint64 address = line * m_options.linelength + this->baseAddress();
        QString addrstr = QString::number(address, 16)
                              .rightJustified(this->addressWidth(), '0')
                              .toUpper();

        // Address Part
        QTextCharFormat acf;
        acf.setForeground(m_options.headercolor);

        if(m_options.hasFlag(QHexFlags::StyledAddress))
            acf.setBackground(this->palette().color(QPalette::Window));

        if(m_hexdelegate)
            m_hexdelegate->renderAddress(address, acf, this);

        if(m_hexcursor->line() == static_cast<qint64>(line) &&
           m_options.hasFlag(QHexFlags::HighlightAddress)) {
            acf.setBackground(this->palette().color(QPalette::Highlight));
            acf.setForeground(this->palette().color(QPalette::HighlightedText));
        }

        c.insertText(" " + addrstr + " ", acf);

        QByteArray linebytes = this->getLine(line);
        c.insertText(" ", {});

        // Hex Part
        for(unsigned int column = 0u; column < m_options.linelength;) {
            QTextCharFormat cf;

            for(unsigned int byteidx = 0u; byteidx < m_options.grouplength;
                byteidx++, column++) {
                QString s;
                quint8 b{};

                if(m_hexdocument->accept(
                       this->positionFromLineCol(line, column))) {
                    s = linebytes.isEmpty() ||
                                column >= static_cast<qint64>(linebytes.size())
                            ? "  "
                            : QString(QHexUtils::toHex(linebytes.mid(column, 1))
                                          .toUpper());
                    b = static_cast<int>(column) < linebytes.size()
                            ? linebytes.at(column)
                            : 0x00;
                }
                else
                    s = QString(m_options.invalidchar).repeated(2);

                cf = this->drawFormat(c, b, s, QHexArea::Hex, line, column,
                                      static_cast<int>(column) <
                                          linebytes.size());
            }

            c.insertText(" ", cf);
        }

        c.insertText(" ", {});

        // Ascii Part
        for(unsigned int column = 0u; column < m_options.linelength; column++) {
            QString s;
            quint8 b{};

            if(m_hexdocument->accept(this->positionFromLineCol(line, column))) {
                s = linebytes.isEmpty() ||
                            column >= static_cast<qint64>(linebytes.size())
                        ? QChar(' ')
                        : (QChar::isPrint(linebytes.at(column))
                               ? QChar(linebytes.at(column))
                               : m_options.unprintablechar);

                b = static_cast<int>(column) < linebytes.size()
                        ? linebytes.at(column)
                        : 0x00;
            }
            else
                s = m_options.invalidchar;

            this->drawFormat(c, b, s, QHexArea::Ascii, line, column,
                             static_cast<int>(column) < linebytes.size());
        }

        QTextBlockFormat bf;

        if(m_options.linealternatebackground.isValid() && line % 2)
            bf.setBackground(m_options.linealternatebackground);
        else if(m_options.linebackground.isValid() && !(line % 2))
            bf.setBackground(m_options.linebackground);

        c.setBlockFormat(bf);
        c.insertBlock({});
        if(m_hexdocument->isEmpty())
            break;
    }
}